

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  _func_char_ptr_ENCODING_ptr_char_ptr *p_Var3;
  _func_int_ENCODING_ptr_char_ptr *p_Var4;
  _func_int_ENCODING_ptr_char_ptr_int_ATTRIBUTE_ptr *p_Var5;
  SCANNER p_Var6;
  long *plVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  ATTRIBUTE *pAVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  long lVar13;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  undefined1 *puVar14;
  undefined1 *puVar15;
  long *plVar16;
  undefined8 *puVar17;
  undefined1 *puVar18;
  byte *pbVar19;
  byte *pbVar20;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  
  puVar15 = auStack_38;
  puVar18 = auStack_38;
  puVar14 = auStack_38;
  uVar9 = (long)end - (long)ptr;
  if ((long)uVar9 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  pAVar12 = (ATTRIBUTE *)(ulong)bVar1;
  uStack_40 = 1;
  lVar10 = 1;
  lVar13 = lVar10;
  plVar7 = (long *)auStack_38;
  if (bVar1 == 0x18) goto LAB_00604a59;
  pbVar19 = (byte *)ptr;
  if (bVar1 == 6) {
    if (uVar9 < 3) {
LAB_006049c2:
      *(undefined8 *)(puVar14 + -8) = 0xfffffffffffffffe;
      return (int)*(undefined8 *)(puVar14 + -8);
    }
    uStack_40 = 0x6049d7;
    pcVar11 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar11 == 0) {
      uStack_40 = 0x6049ec;
      iVar8 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_01,&pAVar12->name);
      goto LAB_00604ad6;
    }
  }
  else if (bVar1 == 7) {
    puVar14 = auStack_38;
    if (uVar9 < 4) goto LAB_006049c2;
    uStack_40 = 0x604929;
    iVar8 = (*enc[3].getAtts)(enc,ptr,1,pAVar12);
    if (iVar8 == 0) {
      uStack_40 = 0x60493e;
      iVar8 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_00,(char *)pAVar12);
      goto LAB_00604a4e;
    }
  }
  else if (bVar1 == 0x13) {
    pbVar19 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar19 || (long)end - (long)pbVar19 < 0) {
      return -1;
    }
    if ((ulong)*pbVar19 == 0x78) {
      pbVar19 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar19 || (long)end - (long)pbVar19 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar19) & 0xfe) == 0x18) {
        pbVar19 = (byte *)(ptr + 3);
        lVar10 = uVar9 - 3;
        while( true ) {
          if (lVar10 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar19);
          if (1 < bVar1 - 0x18) break;
          pbVar19 = pbVar19 + 1;
          lVar10 = lVar10 + -1;
        }
        if (bVar1 == 0x12) {
          pbVar20 = pbVar19 + 1;
          goto LAB_00604a46;
        }
      }
    }
    else if (*(char *)((long)enc[1].scanners + (ulong)*pbVar19) == '\x19') {
      lVar10 = uVar9 - 2;
      pbVar20 = (byte *)(ptr + 2);
      do {
        pbVar19 = pbVar20;
        if (lVar10 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar19);
        pbVar20 = pbVar19 + 1;
        lVar10 = lVar10 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 == '\x12') {
LAB_00604a46:
        puVar17 = &uStack_40;
        uStack_40 = 10;
LAB_00604aa8:
        iVar8 = (int)*puVar17;
        pbVar19 = pbVar20;
        goto LAB_00604b39;
      }
    }
  }
  else {
    plVar7 = (long *)auStack_38;
    if (bVar1 == 0x16) goto LAB_00604a59;
    if (bVar1 == 5) {
      puVar14 = auStack_38;
      if (uVar9 == 1) goto LAB_006049c2;
      uStack_40 = 0x6048f8;
      iVar8 = (*enc[3].nameLength)(enc,ptr);
      if (iVar8 == 0) {
        uStack_40 = 0x60490d;
        iVar8 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX,&pAVar12->name);
        puVar15 = auStack_38;
LAB_00604a4a:
        plVar16 = (long *)(puVar15 + -8);
        *(undefined8 *)(puVar15 + -8) = 2;
        while( true ) {
          lVar13 = *plVar16;
          plVar7 = plVar16 + 1;
          pbVar19 = (byte *)ptr;
          if (iVar8 == 0) break;
LAB_00604a59:
          do {
            puVar15 = (undefined1 *)plVar7;
            ptr = (char *)((byte *)ptr + lVar13);
            uVar9 = (long)end - (long)ptr;
            if ((long)uVar9 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            pAVar12 = (ATTRIBUTE *)(ulong)bVar1;
            lVar13 = lVar10;
            plVar7 = (long *)puVar15;
          } while (bVar1 - 0x18 < 4);
          puVar14 = puVar15;
          pbVar19 = (byte *)ptr;
          if (bVar1 == 5) {
            if (uVar9 == 1) goto LAB_006049c2;
            p_Var4 = enc[3].nameLength;
            *(undefined8 *)(puVar15 + -8) = 0x604af4;
            iVar8 = (*p_Var4)(enc,ptr);
            if (iVar8 != 0) break;
            p_Var6 = enc[3].scanners[0];
            *(undefined8 *)(puVar15 + -8) = 0x604b05;
            iVar8 = (*p_Var6)(enc,ptr,extraout_RDX_03,&pAVar12->name);
            goto LAB_00604a4a;
          }
          if (bVar1 == 6) {
            if (uVar9 < 3) goto LAB_006049c2;
            p_Var3 = enc[3].skipS;
            *(undefined8 *)(puVar15 + -8) = 0x604ac5;
            pcVar11 = (*p_Var3)(enc,ptr);
            if ((int)pcVar11 != 0) break;
            p_Var6 = enc[3].scanners[1];
            *(undefined8 *)(puVar15 + -8) = 0x604ad6;
            iVar8 = (*p_Var6)(enc,ptr,extraout_RDX_02,&pAVar12->name);
            puVar18 = puVar15;
LAB_00604ad6:
            plVar16 = (long *)(puVar18 + -8);
            *(undefined8 *)(puVar18 + -8) = 3;
          }
          else {
            if (bVar1 != 7) {
              if (bVar1 != 0x16) {
                if (bVar1 != 0x12) break;
                pbVar20 = (byte *)ptr + 1;
                puVar17 = (undefined8 *)(puVar15 + -8);
                *(undefined8 *)(puVar15 + -8) = 9;
                goto LAB_00604aa8;
              }
              goto LAB_00604a59;
            }
            if (uVar9 < 4) goto LAB_006049c2;
            p_Var5 = enc[3].getAtts;
            *(undefined8 *)(puVar15 + -8) = 0x604b21;
            iVar8 = (*p_Var5)(enc,ptr,1,pAVar12);
            if (iVar8 != 0) break;
            p_Var6 = enc[3].scanners[2];
            *(undefined8 *)(puVar15 + -8) = 0x604b32;
            iVar8 = (*p_Var6)(enc,ptr,extraout_RDX_04,&pAVar12->name);
LAB_00604a4e:
            plVar16 = (long *)(puVar15 + -8);
            *(undefined8 *)(puVar15 + -8) = 4;
          }
        }
      }
    }
  }
  iVar8 = 0;
LAB_00604b39:
  *nextTokPtr = (char *)pbVar19;
  return iVar8;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}